

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

void Llb_MnxCheckNextStateVars(Llb_Mnx_t *p)

{
  Aig_Man_t *pAVar1;
  void *pvVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  iVar6 = 0;
  uVar4 = 0;
  uVar5 = 0;
  while( true ) {
    pAVar1 = p->pAig;
    if (pAVar1->nRegs <= iVar6) break;
    pvVar2 = Vec_PtrEntry(pAVar1->vCos,pAVar1->nTruePos + iVar6);
    piVar3 = (int *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe);
    if (((piVar3[6] & 7U) == 2) && (p->pAig->nTruePis <= *piVar3)) {
      if ((*(ulong *)((long)pvVar2 + 8) & 1) == 0) {
        uVar5 = uVar5 + 1;
      }
      else {
        uVar4 = uVar4 + 1;
      }
    }
    iVar6 = iVar6 + 1;
  }
  printf("Total = %d.  Direct LO = %d. Compl LO = %d.\n",(ulong)(uint)pAVar1->nRegs,(ulong)uVar5,
         (ulong)uVar4);
  return;
}

Assistant:

void Llb_MnxCheckNextStateVars( Llb_Mnx_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter0 = 0, Counter1 = 0;
    Saig_ManForEachLi( p->pAig, pObj, i )
        if ( Saig_ObjIsLo(p->pAig, Aig_ObjFanin0(pObj)) )
        {
            if ( Aig_ObjFaninC0(pObj) )
                Counter0++;
            else
                Counter1++;
        }
    printf( "Total = %d.  Direct LO = %d. Compl LO = %d.\n", Aig_ManRegNum(p->pAig), Counter1, Counter0 );
}